

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.c
# Opt level: O0

int rtosc_arg_vals_eq_single(rtosc_arg_val_t *_lhs,rtosc_arg_val_t *_rhs,rtosc_cmp_options *opt)

{
  char cVar1;
  char cVar2;
  int iVar3;
  rtosc_cmp_options *in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar4;
  rtosc_cmp_options *in_stack_00000010;
  size_t in_stack_00000018;
  size_t in_stack_00000020;
  rtosc_arg_val_t *in_stack_00000028;
  rtosc_arg_val_t *in_stack_00000030;
  int32_t rbs;
  int32_t lbs;
  int rval;
  uint local_4c;
  double local_48;
  uint local_3c;
  float local_38;
  uint local_34;
  uint local_1c;
  rtosc_cmp_options *local_18;
  
  local_18 = in_RDX;
  if (in_RDX == (rtosc_cmp_options *)0x0) {
    local_18 = &default_cmp_options;
  }
  if (*in_RDI == *in_RSI) {
    switch(*in_RDI) {
    case 'F':
    case 'I':
    case 'N':
    case 'T':
      local_1c = 1;
      break;
    default:
      exit(1);
    case 'S':
    case 's':
      if ((*(long *)(in_RDI + 8) == 0) || (*(long *)(in_RSI + 8) == 0)) {
        bVar4 = *(long *)(in_RDI + 8) == *(long *)(in_RSI + 8);
      }
      else {
        iVar3 = strcmp(*(char **)(in_RDI + 8),*(char **)(in_RSI + 8));
        bVar4 = iVar3 == 0;
      }
      local_4c = (uint)bVar4;
      local_1c = local_4c;
      break;
    case 'a':
      cVar1 = rtosc_av_arr_type((rtosc_arg_val_t *)0x123513);
      cVar2 = rtosc_av_arr_type((rtosc_arg_val_t *)0x123524);
      if (((cVar1 == cVar2) ||
          ((cVar1 = rtosc_av_arr_type((rtosc_arg_val_t *)0x12353b), cVar1 == 'T' &&
           (cVar1 = rtosc_av_arr_type((rtosc_arg_val_t *)0x12354d), cVar1 == 'F')))) ||
         ((cVar1 = rtosc_av_arr_type((rtosc_arg_val_t *)0x12355f), cVar1 == 'F' &&
          (cVar1 = rtosc_av_arr_type((rtosc_arg_val_t *)0x123571), cVar1 == 'T')))) {
        rtosc_av_arr_len((rtosc_arg_val_t *)0x1235a8);
        rtosc_av_arr_len((rtosc_arg_val_t *)0x1235b9);
        local_1c = rtosc_arg_vals_eq(in_stack_00000030,in_stack_00000028,in_stack_00000020,
                                     in_stack_00000018,in_stack_00000010);
      }
      else {
        local_1c = 0;
      }
      break;
    case 'b':
      local_1c = (uint)(*(int *)(in_RDI + 8) == *(int *)(in_RSI + 8));
      if (local_1c != 0) {
        iVar3 = memcmp(*(void **)(in_RDI + 0x10),*(void **)(in_RSI + 0x10),
                       (long)*(int *)(in_RDI + 8));
        local_1c = (uint)(iVar3 == 0);
      }
      break;
    case 'c':
    case 'i':
    case 'r':
      local_1c = (uint)(*(int *)(in_RDI + 8) == *(int *)(in_RSI + 8));
      break;
    case 'd':
      if ((local_18->float_tolerance != 0.0) || (NAN(local_18->float_tolerance))) {
        if (*(double *)(in_RDI + 8) - *(double *)(in_RSI + 8) < 0.0) {
          local_48 = -(*(double *)(in_RDI + 8) - *(double *)(in_RSI + 8));
        }
        else {
          local_48 = *(double *)(in_RDI + 8) - *(double *)(in_RSI + 8);
        }
        bVar4 = local_48 <= local_18->float_tolerance;
      }
      else {
        bVar4 = *(double *)(in_RDI + 8) == *(double *)(in_RSI + 8);
      }
      local_3c = (uint)bVar4;
      local_1c = local_3c;
      break;
    case 'f':
      if ((local_18->float_tolerance != 0.0) || (NAN(local_18->float_tolerance))) {
        if (*(float *)(in_RDI + 8) - *(float *)(in_RSI + 8) < 0.0) {
          local_38 = -(*(float *)(in_RDI + 8) - *(float *)(in_RSI + 8));
        }
        else {
          local_38 = *(float *)(in_RDI + 8) - *(float *)(in_RSI + 8);
        }
        bVar4 = local_38 <= (float)local_18->float_tolerance;
      }
      else {
        bVar4 = *(float *)(in_RDI + 8) == *(float *)(in_RSI + 8);
      }
      local_34 = (uint)bVar4;
      local_1c = local_34;
      break;
    case 'h':
      local_1c = (uint)(*(long *)(in_RDI + 8) == *(long *)(in_RSI + 8));
      break;
    case 'm':
      iVar3 = memcmp(in_RDI + 8,in_RSI + 8,4);
      local_1c = (uint)(iVar3 == 0);
      break;
    case 't':
      local_1c = (uint)(*(long *)(in_RDI + 8) == *(long *)(in_RSI + 8));
    }
  }
  else {
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

int rtosc_arg_vals_eq_single(const rtosc_arg_val_t* _lhs,
                             const rtosc_arg_val_t* _rhs,
                             const rtosc_cmp_options* opt)
{
#define mfabs(val) (((val) >= 0) ? (val) : -(val))
    int rval;

    if(!opt)
        opt = &default_cmp_options;

    if(_lhs->type == _rhs->type)
    switch(_lhs->type)
    {
        case 'i':
        case 'c':
        case 'r':
            rval = _lhs->val.i == _rhs->val.i;
            break;
        case 'I':
        case 'T':
        case 'F':
        case 'N':
            rval = 1;
            break;
        case 'f':
            rval = (opt->float_tolerance == 0.0)
                   ? _lhs->val.f == _rhs->val.f
                   : mfabs(_lhs->val.f - _rhs->val.f) <=
                   (float)opt->float_tolerance;
            break;
        case 'd':
            rval = (opt->float_tolerance == 0.0)
                   ? _lhs->val.d == _rhs->val.d
                   : mfabs(_lhs->val.d - _rhs->val.d) <=
                   opt->float_tolerance;
            break;
        case 'h':
            rval = _lhs->val.h == _rhs->val.h;
            break;
        case 't':
            rval = _lhs->val.t == _rhs->val.t;
            break;
        case 'm':
            rval = 0 == memcmp(_lhs->val.m, _rhs->val.m, 4);
            break;
        case 's':
        case 'S':
            rval = (_lhs->val.s == NULL || _rhs->val.s == NULL)
                 ? _lhs->val.s == _rhs->val.s
                 : (0 == strcmp(_lhs->val.s, _rhs->val.s));
            break;
        case 'b':
        {
            int32_t lbs = _lhs->val.b.len,
                    rbs = _rhs->val.b.len;
            rval = lbs == rbs;
            if(rval)
                rval = 0 == memcmp(_lhs->val.b.data, _rhs->val.b.data, lbs);
            break;
        }
        case 'a':
        {
            if(     rtosc_av_arr_type(_lhs) != rtosc_av_arr_type(_rhs)
               && !(rtosc_av_arr_type(_lhs) == 'T' && rtosc_av_arr_type(_rhs) == 'F')
               && !(rtosc_av_arr_type(_lhs) == 'F' && rtosc_av_arr_type(_rhs) == 'T'))
                rval = 0;
            else
                rval = rtosc_arg_vals_eq(_lhs+1, _rhs+1,
                                         rtosc_av_arr_len(_lhs), rtosc_av_arr_len(_rhs),
                                         opt);
            break;
        }
        default:
            rval = -1;
            // no recovery: the programmer did not pass the right args, and
            // we don't have a function to compare ranges here
            assert(false);
            exit(1);
            break;
    }
    else
    {
        rval = 0;
    }
    return rval;
#undef mfabs
}